

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int GetLargeValue(VP8BitReader *br,uint8_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int cat;
  int bit0;
  int bit1;
  uint8_t *tab;
  int v;
  int in_stack_ffffffffffffffdc;
  VP8BitReader *in_stack_ffffffffffffffe0;
  VP8BitReader *br_00;
  int local_14;
  
  iVar1 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    iVar1 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      local_14 = 2;
    }
    else {
      local_14 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      local_14 = local_14 + 3;
    }
  }
  else {
    iVar1 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      iVar1 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      if (iVar1 == 0) {
        local_14 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        local_14 = local_14 + 5;
      }
      else {
        iVar1 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        local_14 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        local_14 = local_14 + iVar1 * 2 + 7;
      }
    }
    else {
      iVar1 = VP8GetBit(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      iVar2 = VP8GetBit(in_stack_ffffffffffffffe0,iVar1);
      iVar2 = iVar1 * 2 + iVar2;
      local_14 = 0;
      for (br_00 = (VP8BitReader *)kCat3456[iVar2]; (char)br_00->value != '\0';
          br_00 = (VP8BitReader *)((long)&br_00->value + 1)) {
        iVar3 = VP8GetBit(br_00,iVar1);
        local_14 = local_14 * 2 + iVar3;
      }
      local_14 = (8 << ((byte)iVar2 & 0x1f)) + 3 + local_14;
    }
  }
  return local_14;
}

Assistant:

static int GetLargeValue(VP8BitReader* const br, const uint8_t* const p) {
  int v;
  if (!VP8GetBit(br, p[3], "coeffs")) {
    if (!VP8GetBit(br, p[4], "coeffs")) {
      v = 2;
    } else {
      v = 3 + VP8GetBit(br, p[5], "coeffs");
    }
  } else {
    if (!VP8GetBit(br, p[6], "coeffs")) {
      if (!VP8GetBit(br, p[7], "coeffs")) {
        v = 5 + VP8GetBit(br, 159, "coeffs");
      } else {
        v = 7 + 2 * VP8GetBit(br, 165, "coeffs");
        v += VP8GetBit(br, 145, "coeffs");
      }
    } else {
      const uint8_t* tab;
      const int bit1 = VP8GetBit(br, p[8], "coeffs");
      const int bit0 = VP8GetBit(br, p[9 + bit1], "coeffs");
      const int cat = 2 * bit1 + bit0;
      v = 0;
      for (tab = kCat3456[cat]; *tab; ++tab) {
        v += v + VP8GetBit(br, *tab, "coeffs");
      }
      v += 3 + (8 << cat);
    }
  }
  return v;
}